

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O0

void __thiscall
OpenMD::Ellipsoid::Ellipsoid
          (Ellipsoid *this,Vector3d *origin,RealType rAxial,RealType rEquatorial,Mat3x3d *rotMat)

{
  SquareMatrix3<double> *in_RDX;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  SquareMatrix3<double> *in_stack_ffffffffffffffa8;
  
  Shape::Shape((Shape *)0x38fa48);
  *in_RDI = &PTR__Ellipsoid_00502e50;
  Vector3<double>::Vector3((Vector3<double> *)in_RDX,(Vector3<double> *)in_stack_ffffffffffffffa8);
  in_RDI[8] = in_XMM0_Qa;
  in_RDI[9] = in_XMM1_Qa;
  SquareMatrix3<double>::SquareMatrix3(in_RDX,in_stack_ffffffffffffffa8);
  if ((double)in_RDI[8] < (double)in_RDI[9] || (double)in_RDI[8] == (double)in_RDI[9]) {
    in_RDI[10] = in_RDI[9];
    in_RDI[0xb] = in_RDI[8];
  }
  else {
    in_RDI[10] = in_RDI[8];
    in_RDI[0xb] = in_RDI[9];
  }
  return;
}

Assistant:

Ellipsoid::Ellipsoid(Vector3d origin, RealType rAxial, RealType rEquatorial,
                       Mat3x3d rotMat) :
      origin_(origin),
      rAxial_(rAxial), rEquatorial_(rEquatorial), rotMat_(rotMat) {
    if (rAxial_ > rEquatorial_) {
      rMajor_ = rAxial_;
      rMinor_ = rEquatorial_;
    } else {
      rMajor_ = rEquatorial_;
      rMinor_ = rAxial_;
    }
  }